

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPC_Model.cpp
# Opt level: O3

bool __thiscall Opcode::Model::Build(Model *this,OPCODECREATE *create)

{
  udword *puVar1;
  MeshInterface *pMVar2;
  AABBOptimizedTree *pAVar3;
  bool bVar4;
  int iVar5;
  AABBTree *pAVar6;
  AABBTreeBuilder local_50;
  MeshInterface *local_28;
  
  if (((create->mIMesh != (MeshInterface *)0x0) &&
      (bVar4 = MeshInterface::IsValid(create->mIMesh), bVar4)) && ((create->mSettings).mLimit == 1))
  {
    MeshInterface::CheckTopology(create->mIMesh);
    BaseModel::ReleaseBase(&this->super_BaseModel);
    pMVar2 = create->mIMesh;
    (this->super_BaseModel).mIMesh = pMVar2;
    local_50.mNbPrimitives = pMVar2->mNbTris;
    if (local_50.mNbPrimitives == 1) {
      puVar1 = &(this->super_BaseModel).mModelCode;
      *(byte *)puVar1 = (byte)*puVar1 | 4;
      return true;
    }
    pAVar6 = (AABBTree *)operator_new(0x48);
    AABBTree::AABBTree(pAVar6);
    (this->super_BaseModel).mSource = pAVar6;
    local_50.mNodeBase = (void *)0x0;
    local_50.mCount = 0;
    local_50.mNbInvalidSplits = 0;
    local_50._vptr_AABBTreeBuilder = (_func_int **)&PTR__AABBTreeBuilder_0024e5b8;
    local_28 = create->mIMesh;
    local_50.mSettings = create->mSettings;
    bVar4 = AABBTree::Build(pAVar6,&local_50);
    if (((bVar4) &&
        (bVar4 = BaseModel::CreateTree(&this->super_BaseModel,create->mNoLeaf,create->mQuantized),
        bVar4)) &&
       (pAVar3 = (this->super_BaseModel).mTree,
       iVar5 = (*pAVar3->_vptr_AABBOptimizedTree[2])(pAVar3,(this->super_BaseModel).mSource),
       (char)iVar5 != '\0')) {
      if (create->mKeepOriginal != false) {
        return true;
      }
      pAVar6 = (this->super_BaseModel).mSource;
      if (pAVar6 == (AABBTree *)0x0) {
        return true;
      }
      AABBTree::~AABBTree(pAVar6);
      operator_delete(pAVar6,0x48);
      (this->super_BaseModel).mSource = (AABBTree *)0x0;
      return true;
    }
  }
  return false;
}

Assistant:

bool Model::Build(const OPCODECREATE& create)
{
	// 1) Checkings
	if(!create.mIMesh || !create.mIMesh->IsValid())	return false;

	// For this model, we only support complete trees
	if(create.mSettings.mLimit!=1)	return SetIceError("OPCODE WARNING: supports complete trees only! Use mLimit = 1.\n", null);

	// Look for degenerate faces.
	udword NbDegenerate = create.mIMesh->CheckTopology();
	if(NbDegenerate)	Log("OPCODE WARNING: found %d degenerate faces in model! Collision might report wrong results!\n", NbDegenerate);
	// We continue nonetheless.... 

	Release();	// Make sure previous tree has been discarded [Opcode 1.3, thanks Adam]

	// 1-1) Setup mesh interface automatically [Opcode 1.3]
	SetMeshInterface(create.mIMesh);

	// Special case for 1-triangle meshes [Opcode 1.3]
	udword NbTris = create.mIMesh->GetNbTriangles();
	if(NbTris==1)
	{
		// We don't need to actually create a tree here, since we'll only have a single triangle to deal with anyway.
		// It's a waste to use a "model" for this but at least it will work.
		mModelCode |= OPC_SINGLE_NODE;
		return true;
	}

	// 2) Build a generic AABB Tree.
	mSource = new AABBTree;
	CHECKALLOC(mSource);

	// 2-1) Setup a builder. Our primitives here are triangles from input mesh,
	// so we use an AABBTreeOfTrianglesBuilder.....
	{
		AABBTreeOfTrianglesBuilder TB;
		TB.mIMesh			= create.mIMesh;
		TB.mSettings		= create.mSettings;
		TB.mNbPrimitives	= NbTris;
		if(!mSource->Build(&TB))	return false;
	}

	// 3) Create an optimized tree according to user-settings
	if(!CreateTree(create.mNoLeaf, create.mQuantized))	return false;

	// 3-2) Create optimized tree
	if(!mTree->Build(mSource))	return false;

	// 3-3) Delete generic tree if needed
	if(!create.mKeepOriginal)	DELETESINGLE(mSource);

#ifdef __MESHMERIZER_H__
	// 4) Convex hull
	if(create.mCollisionHull)
	{
		// Create hull
		mHull = new CollisionHull;
		CHECKALLOC(mHull);

		CONVEXHULLCREATE CHC;
		// ### doesn't work with strides
		CHC.NbVerts			= create.mIMesh->GetNbVertices();
		CHC.Vertices		= create.mIMesh->GetVerts();
		CHC.UnifyNormals	= true;
		CHC.ReduceVertices	= true;
		CHC.WordFaces		= false;
		mHull->Compute(CHC);
	}
#endif // __MESHMERIZER_H__

	return true;
}